

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
mxx::gather<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          unsigned_long *data,size_t size,int root,comm *comm)

{
  int iVar1;
  reference out;
  comm *comm_local;
  int root_local;
  size_t size_local;
  unsigned_long *data_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *result;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__);
  iVar1 = mxx::comm::rank(comm);
  if (iVar1 == root) {
    iVar1 = mxx::comm::size(comm);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (__return_storage_ptr__,size * (long)iVar1);
  }
  out = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (__return_storage_ptr__,0);
  gather<unsigned_long>(data,size,out,root,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gather(const T* data, size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result;
    if (comm.rank() == root)
        result.resize(size*comm.size());
    gather(data, size, &result[0], root, comm);
    return result;
}